

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

int __thiscall
IfNeuron::addStimulus(IfNeuron *this,StochasticVariable *stochvar,double weight,double revPot)

{
  int iVar1;
  VoltageDependance *this_00;
  allocator<char> local_7a;
  allocator<char> local_79;
  double local_78;
  double local_70;
  string local_68;
  string local_48;
  
  local_78 = weight;
  local_70 = revPot;
  this_00 = (VoltageDependance *)operator_new(0x160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"channel",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Weighted Difference",&local_7a);
  VoltageDependance::VoltageDependance(this_00,local_78,local_70,&local_48,&local_68);
  iVar1 = DifferentialEquation::addTerm
                    (&this->ifneuronMembrane,(StochasticFunction *)this_00,stochvar);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

int IfNeuron::addStimulus( StochasticVariable *stochvar, double weight, double revPot )
{
	return ifneuronMembrane.addTerm( new VoltageDependance(weight, revPot, "channel"), stochvar );
}